

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool roaring_uint32_iterator_previous(roaring_uint32_iterator_t *it)

{
  int iVar1;
  _Bool _Var2;
  uint16_t low16;
  ushort local_a;
  
  if (it->container_index < 0) {
    it->has_value = false;
    _Var2 = false;
  }
  else {
    iVar1 = (it->parent->high_low_container).size;
    if (it->container_index < iVar1) {
      local_a = (ushort)it->current_value;
      _Var2 = container_iterator_prev(it->container,it->typecode,&it->container_it,&local_a);
      if (_Var2) {
        it->current_value = (uint)local_a | it->highbits;
        _Var2 = true;
      }
      else {
        it->container_index = it->container_index + -1;
        _Var2 = loadlastvalue(it);
      }
      it->has_value = _Var2;
    }
    else {
      it->container_index = iVar1 + -1;
      _Var2 = loadlastvalue(it);
      it->has_value = _Var2;
    }
  }
  return _Var2;
}

Assistant:

bool roaring_uint32_iterator_previous(roaring_uint32_iterator_t *it) {
    if (it->container_index < 0) {
        return (it->has_value = false);
    }
    if (it->container_index >= it->parent->high_low_container.size) {
        it->container_index = it->parent->high_low_container.size - 1;
        return (it->has_value = loadlastvalue(it));
    }
    uint16_t low16 = (uint16_t)it->current_value;
    if (container_iterator_prev(it->container, it->typecode, &it->container_it,
                                &low16)) {
        it->current_value = it->highbits | low16;
        return (it->has_value = true);
    }
    it->container_index--;
    return (it->has_value = loadlastvalue(it));
}